

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_parse_url_path(connectdata *conn)

{
  int *piVar1;
  curl_ftpfile cVar2;
  SessionHandle *data;
  SessionHandle *handle;
  bool bVar3;
  _Bool _Var4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  char **ppcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  CURLcode unaff_EBP;
  CURLcode CVar12;
  ulong uVar13;
  char cVar14;
  int dlen;
  int local_44;
  ftp_conn *local_40;
  HTTP *local_38;
  
  data = conn->data;
  pcVar10 = (data->state).path;
  local_38 = (data->state).proto.http;
  local_40 = (ftp_conn *)&conn->proto;
  (conn->proto).ftpc.ctl_valid = false;
  (conn->proto).ftpc.cwdfail = false;
  cVar2 = (data->set).ftp_filemethod;
  if (cVar2 == FTPFILE_SINGLECWD) {
    if (*pcVar10 == '\0') {
      (conn->proto).ftpc.dirdepth = 0;
LAB_0011835c:
      pcVar10 = (char *)0x0;
    }
    else {
      pcVar9 = strrchr(pcVar10,0x2f);
      if (pcVar9 != (char *)0x0) {
        ppcVar8 = (char **)(*Curl_ccalloc)(1,8);
        (conn->proto).ftpc.dirs = ppcVar8;
        unaff_EBP = CURLE_OUT_OF_MEMORY;
        if (ppcVar8 == (char **)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        handle = conn->data;
        iVar5 = curlx_sztosi((long)pcVar9 - (long)pcVar10);
        pcVar10 = curl_easy_unescape(handle,pcVar10,iVar5,(int *)0x0);
        *(conn->proto).ftpc.dirs = pcVar10;
        if (*(conn->proto).ftpc.dirs == (char *)0x0) {
          freedirs(local_40);
          return CURLE_OUT_OF_MEMORY;
        }
        (conn->proto).ftpc.dirdepth = 1;
        pcVar10 = pcVar9 + 1;
      }
    }
LAB_0011835f:
    if ((pcVar10 == (char *)0x0) || (*pcVar10 == '\0')) {
      (conn->proto).ftpc.file = (char *)0x0;
LAB_001183b0:
      if ((((data->set).upload != true) || ((conn->proto).ftpc.file != (char *)0x0)) ||
         (*(int *)&local_38->p_pragma != 0)) {
        (conn->proto).ftpc.cwddone = false;
        if ((conn->proto).ftpc.prevpath != (char *)0x0) {
          iVar5 = 0;
          pcVar10 = curl_easy_unescape(conn->data,(data->state).path,0,&local_44);
          if (pcVar10 == (char *)0x0) {
            freedirs(local_40);
            unaff_EBP = CURLE_OUT_OF_MEMORY;
          }
          else {
            pcVar9 = (conn->proto).ftpc.file;
            if (pcVar9 != (char *)0x0) {
              sVar7 = strlen(pcVar9);
              iVar5 = curlx_uztosi(sVar7);
            }
            iVar5 = local_44 - iVar5;
            local_44 = iVar5;
            sVar7 = strlen((conn->proto).ftpc.prevpath);
            iVar6 = curlx_uztosi(sVar7);
            if ((iVar5 == iVar6) &&
               (iVar5 = curl_strnequal(pcVar10,(conn->proto).ftpc.prevpath,(long)local_44),
               iVar5 != 0)) {
              Curl_infof(data,"Request has same path as previous transfer\n");
              (conn->proto).ftpc.cwddone = true;
            }
            (*Curl_cfree)(pcVar10);
          }
          if (pcVar10 == (char *)0x0) {
            return unaff_EBP;
          }
        }
        return CURLE_OK;
      }
      Curl_failf(data,"Uploading to a URL without a file name!");
    }
    else {
      pcVar10 = curl_easy_unescape(conn->data,pcVar10,0,(int *)0x0);
      (conn->proto).ftpc.file = pcVar10;
      if (pcVar10 == (char *)0x0) {
        freedirs(local_40);
        Curl_failf(data,"no memory");
        goto LAB_001184c8;
      }
      _Var4 = isBadFtpString(pcVar10);
      if (!_Var4) goto LAB_001183b0;
      freedirs(local_40);
    }
    CVar12 = CURLE_URL_MALFORMAT;
  }
  else {
    if (cVar2 == FTPFILE_NOCWD) {
      if ((pcVar10 == (char *)0x0) || (*pcVar10 == '\0')) goto LAB_0011835c;
      sVar7 = strlen(pcVar10);
      if (pcVar10[sVar7 - 1] == '/') {
        pcVar10 = (char *)0x0;
      }
      goto LAB_0011835f;
    }
    (conn->proto).imapc.idstr = (char *)0x500000000;
    ppcVar8 = (char **)(*Curl_ccalloc)(5,8);
    (conn->proto).ftpc.dirs = ppcVar8;
    if (ppcVar8 != (char **)0x0) {
      iVar5 = curl_strequal(pcVar10,"/");
      if (iVar5 == 0) {
        pcVar9 = strchr(pcVar10,0x2f);
        while (pcVar9 != (char *)0x0) {
          pcVar11 = (data->state).path;
          uVar13 = 0;
          if (pcVar10 != pcVar11 && -1 < (long)pcVar10 - (long)pcVar11) {
            uVar13 = (ulong)((conn->proto).ftpc.dirdepth == 0);
          }
          if ((long)pcVar9 - (long)pcVar10 == 0) {
            cVar14 = '\x03';
LAB_0011860c:
            pcVar10 = pcVar9 + 1;
          }
          else {
            iVar5 = curlx_sztosi(((long)pcVar9 - (long)pcVar10) + uVar13);
            pcVar11 = curl_easy_unescape(conn->data,pcVar10 + -uVar13,iVar5,(int *)0x0);
            iVar5 = (conn->proto).ftpc.dirdepth;
            (conn->proto).ftpc.dirs[iVar5] = pcVar11;
            pcVar11 = (conn->proto).ftpc.dirs[iVar5];
            if (pcVar11 == (char *)0x0) {
              Curl_failf(data,"no memory");
              unaff_EBP = CURLE_OUT_OF_MEMORY;
LAB_00118591:
              freedirs(local_40);
              bVar3 = false;
            }
            else {
              _Var4 = isBadFtpString(pcVar11);
              bVar3 = true;
              if (_Var4) {
                (*Curl_cfree)(pcVar11);
                unaff_EBP = CURLE_URL_MALFORMAT;
                goto LAB_00118591;
              }
            }
            cVar14 = '\x01';
            if (bVar3) {
              iVar6 = (conn->proto).ftpc.dirdepth + 1;
              (conn->proto).ftpc.dirdepth = iVar6;
              iVar5 = (conn->proto).ftpc.diralloc;
              cVar14 = '\0';
              if (iVar5 <= iVar6) {
                (conn->proto).ftpc.diralloc = iVar5 * 2;
                ppcVar8 = (char **)(*Curl_crealloc)((conn->proto).ftpc.dirs,(long)iVar5 << 4);
                if (ppcVar8 == (char **)0x0) {
                  freedirs(local_40);
                  unaff_EBP = CURLE_OUT_OF_MEMORY;
                }
                else {
                  (conn->proto).ftpc.dirs = ppcVar8;
                }
                cVar14 = ppcVar8 == (char **)0x0;
              }
              goto LAB_0011860c;
            }
          }
          if ((cVar14 != '\x03') && (cVar14 != '\0')) {
            return unaff_EBP;
          }
          pcVar9 = strchr(pcVar10,0x2f);
        }
      }
      else {
        pcVar9 = (*Curl_cstrdup)("/");
        *(conn->proto).ftpc.dirs = pcVar9;
        piVar1 = &(conn->proto).ftpc.dirdepth;
        *piVar1 = *piVar1 + 1;
        pcVar10 = pcVar10 + 1;
      }
      goto LAB_0011835f;
    }
LAB_001184c8:
    CVar12 = CURLE_OUT_OF_MEMORY;
  }
  return CVar12;
}

Assistant:

static
CURLcode ftp_parse_url_path(struct connectdata *conn)
{
  struct SessionHandle *data = conn->data;
  /* the ftp struct is already inited in ftp_connect() */
  struct FTP *ftp = data->state.proto.ftp;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  const char *slash_pos;  /* position of the first '/' char in curpos */
  const char *path_to_use = data->state.path;
  const char *cur_pos;
  const char *filename = NULL;

  cur_pos = path_to_use; /* current position in path. point at the begin
                            of next path component */

  ftpc->ctl_valid = FALSE;
  ftpc->cwdfail = FALSE;

  switch(data->set.ftp_filemethod) {
  case FTPFILE_NOCWD:
    /* fastest, but less standard-compliant */

    /*
      The best time to check whether the path is a file or directory is right
      here. so:

      the first condition in the if() right here, is there just in case
      someone decides to set path to NULL one day
   */
    if(data->state.path &&
       data->state.path[0] &&
       (data->state.path[strlen(data->state.path) - 1] != '/') )
      filename = data->state.path;  /* this is a full file path */
      /*
        ftpc->file is not used anywhere other than for operations on a file.
        In other words, never for directory operations.
        So we can safely leave filename as NULL here and use it as a
        argument in dir/file decisions.
      */
    break;

  case FTPFILE_SINGLECWD:
    /* get the last slash */
    if(!path_to_use[0]) {
      /* no dir, no file */
      ftpc->dirdepth = 0;
      break;
    }
    slash_pos=strrchr(cur_pos, '/');
    if(slash_pos || !*cur_pos) {
      ftpc->dirs = calloc(1, sizeof(ftpc->dirs[0]));
      if(!ftpc->dirs)
        return CURLE_OUT_OF_MEMORY;

      ftpc->dirs[0] = curl_easy_unescape(conn->data, slash_pos ? cur_pos : "/",
                                         slash_pos ?
                                         curlx_sztosi(slash_pos-cur_pos) : 1,
                                         NULL);
      if(!ftpc->dirs[0]) {
        freedirs(ftpc);
        return CURLE_OUT_OF_MEMORY;
      }
      ftpc->dirdepth = 1; /* we consider it to be a single dir */
      filename = slash_pos ? slash_pos+1 : cur_pos; /* rest is file name */
    }
    else
      filename = cur_pos;  /* this is a file name only */
    break;

  default: /* allow pretty much anything */
  case FTPFILE_MULTICWD:
    ftpc->dirdepth = 0;
    ftpc->diralloc = 5; /* default dir depth to allocate */
    ftpc->dirs = calloc(ftpc->diralloc, sizeof(ftpc->dirs[0]));
    if(!ftpc->dirs)
      return CURLE_OUT_OF_MEMORY;

    /* we have a special case for listing the root dir only */
    if(strequal(path_to_use, "/")) {
      cur_pos++; /* make it point to the zero byte */
      ftpc->dirs[0] = strdup("/");
      ftpc->dirdepth++;
    }
    else {
      /* parse the URL path into separate path components */
      while((slash_pos = strchr(cur_pos, '/')) != NULL) {
        /* 1 or 0 pointer offset to indicate absolute directory */
        ssize_t absolute_dir = ((cur_pos - data->state.path > 0) &&
                                (ftpc->dirdepth == 0))?1:0;

        /* seek out the next path component */
        if(slash_pos-cur_pos) {
          /* we skip empty path components, like "x//y" since the FTP command
             CWD requires a parameter and a non-existent parameter a) doesn't
             work on many servers and b) has no effect on the others. */
          int len = curlx_sztosi(slash_pos - cur_pos + absolute_dir);
          ftpc->dirs[ftpc->dirdepth] =
            curl_easy_unescape(conn->data, cur_pos - absolute_dir, len, NULL);
          if(!ftpc->dirs[ftpc->dirdepth]) { /* run out of memory ... */
            failf(data, "no memory");
            freedirs(ftpc);
            return CURLE_OUT_OF_MEMORY;
          }
          if(isBadFtpString(ftpc->dirs[ftpc->dirdepth])) {
            free(ftpc->dirs[ftpc->dirdepth]);
            freedirs(ftpc);
            return CURLE_URL_MALFORMAT;
          }
        }
        else {
          cur_pos = slash_pos + 1; /* jump to the rest of the string */
          continue;
        }

        cur_pos = slash_pos + 1; /* jump to the rest of the string */
        if(++ftpc->dirdepth >= ftpc->diralloc) {
          /* enlarge array */
          char **bigger;
          ftpc->diralloc *= 2; /* double the size each time */
          bigger = realloc(ftpc->dirs, ftpc->diralloc * sizeof(ftpc->dirs[0]));
          if(!bigger) {
            freedirs(ftpc);
            return CURLE_OUT_OF_MEMORY;
          }
          ftpc->dirs = bigger;
        }
      }
    }
    filename = cur_pos;  /* the rest is the file name */
    break;
  } /* switch */

  if(filename && *filename) {
    ftpc->file = curl_easy_unescape(conn->data, filename, 0, NULL);
    if(NULL == ftpc->file) {
      freedirs(ftpc);
      failf(data, "no memory");
      return CURLE_OUT_OF_MEMORY;
    }
    if(isBadFtpString(ftpc->file)) {
      freedirs(ftpc);
      return CURLE_URL_MALFORMAT;
    }
  }
  else
    ftpc->file=NULL; /* instead of point to a zero byte, we make it a NULL
                       pointer */

  if(data->set.upload && !ftpc->file && (ftp->transfer == FTPTRANSFER_BODY)) {
    /* We need a file name when uploading. Return error! */
    failf(data, "Uploading to a URL without a file name!");
    return CURLE_URL_MALFORMAT;
  }

  ftpc->cwddone = FALSE; /* default to not done */

  if(ftpc->prevpath) {
    /* prevpath is "raw" so we convert the input path before we compare the
       strings */
    int dlen;
    char *path = curl_easy_unescape(conn->data, data->state.path, 0, &dlen);
    if(!path) {
      freedirs(ftpc);
      return CURLE_OUT_OF_MEMORY;
    }

    dlen -= ftpc->file?curlx_uztosi(strlen(ftpc->file)):0;
    if((dlen == curlx_uztosi(strlen(ftpc->prevpath))) &&
       strnequal(path, ftpc->prevpath, dlen)) {
      infof(data, "Request has same path as previous transfer\n");
      ftpc->cwddone = TRUE;
    }
    free(path);
  }

  return CURLE_OK;
}